

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_math_imul(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int *piVar1;
  int iVar2;
  JSValueUnion JVar3;
  int64_t iVar4;
  JSValue JVar5;
  int b;
  int a;
  int local_20;
  int local_1c;
  
  JVar5 = *argv;
  if (0xfffffff4 < (uint)argv->tag) {
    *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
  }
  iVar2 = JS_ToInt32Free(ctx,&local_1c,JVar5);
  iVar4 = 6;
  if (iVar2 == 0) {
    piVar1 = (int *)argv[1].u.ptr;
    JVar5 = argv[1];
    if (0xfffffff4 < (uint)argv[1].tag) {
      *piVar1 = *piVar1 + 1;
    }
    iVar2 = JS_ToInt32Free(ctx,&local_20,JVar5);
    if (iVar2 == 0) {
      JVar3._0_4_ = local_20 * local_1c;
      JVar3._4_4_ = 0;
      iVar4 = 0;
      goto LAB_00169528;
    }
  }
  JVar3.float64 = 0.0;
LAB_00169528:
  JVar5.tag = iVar4;
  JVar5.u.float64 = JVar3.float64;
  return JVar5;
}

Assistant:

static JSValue js_math_imul(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv)
{
    int a, b;

    if (JS_ToInt32(ctx, &a, argv[0]))
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &b, argv[1]))
        return JS_EXCEPTION;
    /* purposely ignoring overflow */
    return JS_NewInt32(ctx, a * b);
}